

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_utilities.c
# Opt level: O0

char * trim(char *s)

{
  ushort **ppuVar1;
  bool bVar2;
  char *local_18;
  char *p;
  char *s_local;
  
  p = s;
  while( true ) {
    bVar2 = false;
    if (*p != '\0') {
      ppuVar1 = __ctype_b_loc();
      bVar2 = ((*ppuVar1)[(int)(uint)(byte)*p] & 0x2000) != 0;
    }
    if (!bVar2) break;
    p = p + 1;
  }
  for (local_18 = p; *local_18 != '\0'; local_18 = local_18 + 1) {
  }
  while( true ) {
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)(uint)(byte)local_18[-1]] & 0x2000) == 0) break;
    local_18[-1] = '\0';
    local_18 = local_18 + -1;
  }
  return p;
}

Assistant:

char * trim( char * s )
{
    char * p;

    /* Skip over leading whitespace */
    while ( *s && isspace( (unsigned char)*s ) )
    {
        ++s;
    }

    /* Trim trailing whitespace */
    p = s;

    while ( *p )
    {
        ++p;
    }

    while ( isspace( (unsigned char)*( --p ) ) )
    {
        *p = '\0';
    }

    return s;
}